

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O0

void __thiscall ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,Block *e)

{
  bool bVar1;
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  *this_00;
  reference this_01;
  pointer pSVar2;
  map<unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>_>_>_>
  *this_02;
  pointer pLVar3;
  FunctionDefinition *function;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  *this_03;
  Block *pBVar4;
  undefined1 local_a0 [8];
  undefined1 local_98 [8];
  string block_output;
  int local_60;
  size_t position;
  pair<const_unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>_>
  *call;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  map<unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>_>_>_>
  *__range1_1;
  unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
  *statement;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  *__range1;
  Block *e_local;
  DefaultEvaluator *this_local;
  
  this_00 = parser::element::Block::get_children(e);
  __end1 = std::
           vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
           ::begin(this_00);
  statement = (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
               *)std::
                 vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                 ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>_>
                                *)&statement);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>_>
              ::operator*(&__end1);
    pSVar2 = std::
             unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
             ::operator->(this_01);
    (*(pSVar2->super_ASTElement)._vptr_ASTElement[5])(pSVar2,e);
    pSVar2 = std::
             unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
             ::operator->(this_01);
    (*(pSVar2->super_ASTElement)._vptr_ASTElement[2])(pSVar2,this);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>_>
    ::operator++(&__end1);
  }
  this_02 = parser::element::Block::__get_late_calls(e);
  __end1_1 = std::
             map<unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>_>_>_>
             ::begin(this_02);
  call = (pair<const_unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>_>
          *)std::
            map<unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>_>_>_>
            ::end(this_02);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&call);
    if (!bVar1) break;
    position = (size_t)std::
                       _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>_>_>
                       ::operator*(&__end1_1);
    _local_60 = (Block *)((reference)position)->first;
    parser::element::Block::__set_output_segment_position(e,local_60);
    pLVar3 = std::
             unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
             ::operator->((unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
                           *)(position + 8));
    pBVar4 = parser::util::LateCallDescriptor::get_target_object(pLVar3);
    pLVar3 = std::
             unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
             ::operator->((unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
                           *)(position + 8));
    function = parser::util::LateCallDescriptor::get_function(pLVar3);
    pLVar3 = std::
             unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
             ::operator->((unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
                           *)(position + 8));
    this_03 = parser::util::LateCallDescriptor::get_body(pLVar3);
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    operator->(this_03);
    parser::element::ASTElement::clone<ninx::parser::element::Block>
              ((ASTElement *)&stack0xffffffffffffff98);
    evaluate_function(this,pBVar4,function,
                      (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                       *)&stack0xffffffffffffff98);
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    ~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)&stack0xffffffffffffff98);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>_>_>
    ::operator++(&__end1_1);
  }
  parser::element::Block::__render_output_abi_cxx11_((string *)local_98,e);
  pBVar4 = parser::element::ASTElement::__get_output_block((ASTElement *)e);
  if (pBVar4 == (Block *)0x0) {
    std::operator<<(this->output,(string *)local_98);
  }
  else {
    pBVar4 = parser::element::ASTElement::__get_output_block((ASTElement *)e);
    parser::element::Block::__add_output_segment(pBVar4,(string *)local_98);
  }
  parser::element::ASTElement::clone<ninx::parser::element::Block>((ASTElement *)local_a0);
  replace_return_block
            ((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
              *)local_a0);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_a0);
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::Block *e) {
    for (auto &statement : e->get_children()) {
        statement->__set_output_block(e);
        statement->accept(this);
    }

    // Evaluate late calls
    for (auto& call : e->__get_late_calls()) {
        size_t position {call.first};

        e->__set_output_segment_position(position);

        evaluate_function(call.second->get_target_object(), call.second->get_function(), call.second->get_body()->clone<ninx::parser::element::Block>());
    }

    auto block_output {e->__render_output()};

    if (e->__get_output_block()) {
        e->__get_output_block()->__add_output_segment(block_output);
    }else{
        this->output << block_output;
    }

    // Clone the block and make it available as a return value
    replace_return_block(e->clone<ninx::parser::element::Block>());
}